

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

string * __thiscall
CLI::Option::help_name_abi_cxx11_(string *__return_storage_ptr__,Option *this,bool opt_only)

{
  ostream *poVar1;
  stringstream out;
  string sStack_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  get_name_abi_cxx11_(&local_1c8,this,opt_only);
  poVar1 = ::std::operator<<(local_198,(string *)&local_1c8);
  help_aftername_abi_cxx11_(&sStack_1e8,this);
  ::std::operator<<(poVar1,(string *)&sStack_1e8);
  ::std::__cxx11::string::~string((string *)&sStack_1e8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string help_name(bool opt_only = false) const {
        std::stringstream out;
        out << get_name(opt_only) << help_aftername();
        return out.str();
    }